

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcElementType::~IfcElementType(IfcElementType *this,void **vtt)

{
  void **vtt_local;
  IfcElementType *this_local;
  
  *(void **)&(this->super_IfcTypeProduct).super_IfcTypeObject = *vtt;
  *(void **)(&(this->super_IfcTypeProduct).super_IfcTypeObject.field_0x0 +
            *(long *)(*(long *)&(this->super_IfcTypeProduct).super_IfcTypeObject + -0x18)) =
       vtt[0x19];
  *(void **)&(this->super_IfcTypeProduct).super_IfcTypeObject.field_0x88 = vtt[0x1a];
  (this->super_IfcTypeProduct).super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)vtt[0x1b];
  *(void **)&(this->super_IfcTypeProduct).super_IfcTypeObject.field_0xf0 = vtt[0x1c];
  *(void **)&(this->super_IfcTypeProduct).field_0x148 = vtt[0x1d];
  STEP::Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Maybe((Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
         &(this->super_IfcTypeProduct).field_0x158);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcElementType,_1UL>::~ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcElementType,_1UL> *)
             &(this->super_IfcTypeProduct).field_0x148,vtt + 0x17);
  IfcTypeProduct::~IfcTypeProduct(&this->super_IfcTypeProduct,vtt + 1);
  return;
}

Assistant:

IfcElementType() : Object("IfcElementType") {}